

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

Gia_Man_t * Gia_ManInterTest(Gia_Man_t *p)

{
  long lVar1;
  Gia_Man_t *pSat_00;
  int iVar2;
  abctime aVar3;
  Aig_Obj_t *pAVar4;
  int *pGloVars;
  Int2_Man_t *pIVar5;
  abctime aVar6;
  abctime clk;
  int i;
  int status;
  int Var;
  int Cid;
  int Lit;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vGVars;
  Aig_Man_t *pMan;
  Gia_Man_t *pInter;
  sat_solver2 *pSat;
  Gia_Man_t *p_local;
  
  pSat = (sat_solver2 *)p;
  aVar3 = Abc_Clock();
  iVar2 = Gia_ManRegNum((Gia_Man_t *)pSat);
  if (iVar2 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa8,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  iVar2 = Gia_ManCoNum((Gia_Man_t *)pSat);
  if (iVar2 == 1) {
    vGVars = (Vec_Int_t *)Gia_ManToAigSimple((Gia_Man_t *)pSat);
    pObj = (Aig_Obj_t *)Cnf_Derive((Aig_Man_t *)vGVars,1);
    pInter = (Gia_Man_t *)sat_solver2_new();
    *(int *)&pInter->vLevels = 1;
    sat_solver2_setnvars((sat_solver2 *)pInter,*(int *)&pObj->pFanin0 * 2 + 1);
    for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vGVars + 2)), clk._4_4_ < iVar2;
        clk._4_4_ = clk._4_4_ + 1) {
      _Cid = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vGVars + 2),clk._4_4_);
      if ((((_Cid != (Aig_Obj_t *)0x0) &&
           (-1 < *(int *)(*(long *)&pObj->TravId + (long)_Cid->Id * 4))) &&
          (iVar2 = Aig_ObjIsCi(_Cid), iVar2 == 0)) && (iVar2 = Aig_ObjIsCo(_Cid), iVar2 == 0)) {
        var_set_partA((sat_solver2 *)pInter,*(int *)(*(long *)&pObj->TravId + (long)_Cid->Id * 4),1)
        ;
      }
    }
    for (clk._4_4_ = 0; clk._4_4_ < *(int *)&pObj->pFanin1; clk._4_4_ = clk._4_4_ + 1) {
      iVar2 = sat_solver2_addclause
                        ((sat_solver2 *)pInter,
                         *(lit **)(*(long *)&pObj->field_0x18 + (long)clk._4_4_ * 8),
                         *(lit **)(*(long *)&pObj->field_0x18 + (long)(clk._4_4_ + 1) * 8),-1);
      clause2_set_partA((sat_solver2 *)pInter,iVar2,1);
    }
    Cnf_DataLift((Cnf_Dat_t *)pObj,*(int *)&pObj->pFanin0);
    for (clk._4_4_ = 0; clk._4_4_ < *(int *)&pObj->pFanin1; clk._4_4_ = clk._4_4_ + 1) {
      sat_solver2_addclause
                ((sat_solver2 *)pInter,*(lit **)(*(long *)&pObj->field_0x18 + (long)clk._4_4_ * 8),
                 *(lit **)(*(long *)&pObj->field_0x18 + (long)(clk._4_4_ + 1) * 8),-1);
    }
    Cnf_DataLift((Cnf_Dat_t *)pObj,-*(int *)&pObj->pFanin0);
    iVar2 = Aig_ManCoNum((Aig_Man_t *)vGVars);
    pCnf = (Cnf_Dat_t *)Vec_IntAlloc(iVar2 + 1);
    for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vGVars + 1)), clk._4_4_ < iVar2;
        clk._4_4_ = clk._4_4_ + 1) {
      _Cid = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vGVars + 1),clk._4_4_);
      iVar2 = *(int *)(*(long *)&pObj->TravId + (long)_Cid->Id * 4);
      sat_solver2_add_buffer((sat_solver2 *)pInter,iVar2,*(int *)&pObj->pFanin0 + iVar2,0,0,-1);
      Vec_IntPush((Vec_Int_t *)pCnf,iVar2);
    }
    lVar1 = *(long *)&pObj->TravId;
    pAVar4 = Aig_ManCo((Aig_Man_t *)vGVars,0);
    iVar2 = *(int *)(lVar1 + (long)pAVar4->Id * 4);
    sat_solver2_add_xor((sat_solver2 *)pInter,iVar2,*(int *)&pObj->pFanin0 + iVar2,
                        *(int *)&pObj->pFanin0 << 1,0,0,-1);
    Vec_IntPush((Vec_Int_t *)pCnf,iVar2);
    pSat_00 = pInter;
    pGloVars = Vec_IntArray((Vec_Int_t *)pCnf);
    iVar2 = Vec_IntSize((Vec_Int_t *)pCnf);
    pIVar5 = Int2_ManStart((sat_solver2 *)pSat_00,pGloVars,iVar2);
    pInter->vCofVars = (Vec_Int_t *)pIVar5;
    Var = toLitCond(*(int *)&pObj->pFanin0 << 1,0);
    iVar2 = sat_solver2_solve((sat_solver2 *)pInter,&Var,&Cid,0,0,0,0);
    if (iVar2 == -1) {
      Sat_Solver2PrintStats(_stdout,(sat_solver2 *)pInter);
      pMan = (Aig_Man_t *)Int2_ManReadInterpolant((sat_solver2 *)pInter);
      Gia_ManPrintStats((Gia_Man_t *)pMan,(Gps_Par_t *)0x0);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Total interpolation time",aVar6 - aVar3);
      Vec_IntFree((Vec_Int_t *)pCnf);
      Cnf_DataFree((Cnf_Dat_t *)pObj);
      Aig_ManStop((Aig_Man_t *)vGVars);
      sat_solver2_delete((sat_solver2 *)pInter);
      return (Gia_Man_t *)pMan;
    }
    __assert_fail("status == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xda,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  __assert_fail("Gia_ManCoNum(p) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                ,0xa9,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManInterTest( Gia_Man_t * p )
{
    sat_solver2 * pSat;
    Gia_Man_t * pInter;
    Aig_Man_t * pMan;
    Vec_Int_t * vGVars;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int Lit, Cid, Var, status, i;
    abctime clk = Abc_Clock();
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) == 1 );

    // derive CNFs
    pMan = Gia_ManToAigSimple( p );
    pCnf = Cnf_Derive( pMan, 1 );

    // start the solver
    pSat = sat_solver2_new();
    pSat->fVerbose = 1;
    sat_solver2_setnvars( pSat, 2*pCnf->nVars+1 );

    // set A-variables (all used except PI/PO, which will be global variables)
    Aig_ManForEachObj( pMan, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && !Aig_ObjIsCi(pObj) && !Aig_ObjIsCo(pObj) )
            var_set_partA( pSat, pCnf->pVarNums[pObj->Id], 1 );

    // add clauses of A
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        Cid = sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
        clause2_set_partA( pSat, Cid, 1 ); // this API should be called for each clause of A
    }

    // add clauses of B (after shifting all CNF variables by pCnf->nVars)
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
    Cnf_DataLift( pCnf, -pCnf->nVars );

    // add PI equality clauses
    vGVars = Vec_IntAlloc( Aig_ManCoNum(pMan)+1 );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        Var = pCnf->pVarNums[pObj->Id];
        sat_solver2_add_buffer( pSat, Var, pCnf->nVars + Var, 0, 0, -1 );
        Vec_IntPush( vGVars, Var );
    }

    // add an XOR clause in the end
    Var = pCnf->pVarNums[Aig_ManCo(pMan,0)->Id];
    sat_solver2_add_xor( pSat, Var, pCnf->nVars + Var, 2*pCnf->nVars, 0, 0, -1 );
    Vec_IntPush( vGVars, Var );

    // start the interpolation manager
    pSat->pInt2 = Int2_ManStart( pSat, Vec_IntArray(vGVars), Vec_IntSize(vGVars) );

    // solve the problem
    Lit = toLitCond( 2*pCnf->nVars, 0 );
    status = sat_solver2_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
    assert( status == l_False );
    Sat_Solver2PrintStats( stdout, pSat );

    // derive interpolant
    pInter = (Gia_Man_t *)Int2_ManReadInterpolant( pSat );
    Gia_ManPrintStats( pInter, NULL );
    Abc_PrintTime( 1, "Total interpolation time", Abc_Clock() - clk );

    // clean up
    Vec_IntFree( vGVars );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pMan );
    sat_solver2_delete( pSat );

    // return interpolant
    return pInter;
}